

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O3

Json * Json::parseFile(Json *__return_storage_ptr__,string *path_to_file)

{
  char cVar1;
  string data;
  path path;
  ifstream f;
  string local_280;
  path local_260;
  char local_220 [520];
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            (&local_260,path_to_file);
  std::ifstream::ifstream(local_220,local_260._M_pathname._M_dataplus._M_p,_S_in);
  cVar1 = std::experimental::filesystem::v1::file_size(&local_260);
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_280,cVar1);
  std::istream::read(local_220,(long)local_280._M_dataplus._M_p);
  Json(__return_storage_ptr__,&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(local_220);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_260);
  return __return_storage_ptr__;
}

Assistant:

Json Json::parseFile(const std::string& path_to_file) {
    std::experimental::filesystem::path path(path_to_file);
    std::ifstream f(path);
    const auto size = std::experimental::filesystem::file_size(path);
    std::string data(size, ' ');
    f.read(data.data(), size);
    return Json(data);
}